

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v7::print<char[7],std::basic_string_view<char,std::char_traits<char>>const&,int,char>
               (basic_ostream<char,_std::char_traits<char>_> *os,char (*format_str) [7],
               basic_string_view<char,_std::char_traits<char>_> *args,int *args_1)

{
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  char *local_38;
  size_t local_30;
  ulong local_28;
  
  format_str_00 = to_string_view<char,_0>(*format_str);
  local_30 = args->_M_len;
  local_38 = args->_M_str;
  local_28 = (ulong)(uint)*args_1;
  args_00.field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_38;
  args_00.desc_ = 0x1d;
  vprint<char>(os,format_str_00,args_00);
  return;
}

Assistant:

void print(std::basic_ostream<Char>& os, const S& format_str, Args&&... args) {
  vprint(os, to_string_view(format_str),
         fmt::make_args_checked<Args...>(format_str, args...));
}